

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::GetPropertyReference_Internal
               (Var instance,RecyclableObject *propertyObject,bool isRoot,PropertyId propertyId,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  BOOL BVar6;
  RootObjectBase *pRVar7;
  PropertyRecord *pPVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  undefined7 in_register_00000011;
  Var local_48;
  Var property;
  RecyclableObject *object;
  
  object._4_4_ = (undefined4)CONCAT71(in_register_00000011,isRoot);
  bVar3 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar3) {
    PropertyValueInfo::ClearCacheInfo(info);
  }
  property = propertyObject;
  if (object._4_1_ != '\0') {
    pRVar7 = VarTo<Js::RootObjectBase,Js::RecyclableObject>(propertyObject);
    iVar5 = (*(pRVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6d])
                      (pRVar7,instance,(ulong)(uint)propertyId,value,info,requestContext);
    if (iVar5 != 0) goto LAB_00ab7d7d;
  }
  BVar6 = PropertyReferenceWalk_Impl<false>
                    (instance,(RecyclableObject **)&property,propertyId,value,info,requestContext);
  if (BVar6 == 0) {
    pRVar10 = ScriptContext::GetMissingPropertyResult(requestContext);
    *value = pRVar10;
    return 0;
  }
LAB_00ab7d7d:
  if ((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
      (UndeclaredBlockVariable *)*value) {
    JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
  }
  bVar3 = DynamicObject::IsBaseDynamicObject(property);
  if (bVar3) {
    plVar1 = *(long **)(*(long *)((long)property + 8) + 0x28);
    local_48 = (Var)0x0;
    pPVar8 = ScriptContext::GetPropertyName(requestContext,propertyId);
    cVar4 = (**(code **)(*plVar1 + 0x2e0))(plVar1,pPVar8,&local_48,requestContext);
    if ((cVar4 != '\0') && (*value != local_48)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x947,"(value == nullptr || *value == property)",
                                  "value == nullptr || *value == property");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
  }
  CacheOperators::CachePropertyRead
            (instance,(RecyclableObject *)property,(bool)object._4_1_,propertyId,false,info,
             requestContext);
  return 1;
}

Assistant:

BOOL JavascriptOperators::GetPropertyReference_Internal(Var instance, RecyclableObject* propertyObject, const bool isRoot, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo* info)
    {
        if (TaggedNumber::Is(instance))
        {
            PropertyValueInfo::ClearCacheInfo(info);
        }
        BOOL foundProperty = FALSE;
        RecyclableObject* object = propertyObject;

        if (isRoot)
        {
            foundProperty = VarTo<RootObjectBase>(object)->GetRootPropertyReference(instance, propertyId, value, info, requestContext);
        }
        if (!foundProperty)
        {
            foundProperty = PropertyReferenceWalk(instance, &object, propertyId, value, info, requestContext);
        }

        if (!foundProperty)
        {
#if defined(TELEMETRY_JSO) || defined(TELEMETRY_AddToCache) // enabled for `TELEMETRY_AddToCache`, because this is the property-not-found codepath where the normal TELEMETRY_AddToCache code wouldn't be executed.
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                if (info && info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
                {
                    requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, nullptr);
                }
            }
#endif
            *value = requestContext->GetMissingPropertyResult();
            return foundProperty;
        }

        if (requestContext->IsUndeclBlockVar(*value))
        {
            JavascriptError::ThrowReferenceError(requestContext, JSERR_UseBeforeDeclaration);
        }

#if ENABLE_FIXED_FIELDS && DBG
        if (DynamicObject::IsBaseDynamicObject(object))
        {
            DynamicObject* dynamicObject = (DynamicObject*)object;
            DynamicTypeHandler* dynamicTypeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();
            Var property = nullptr;
            if (dynamicTypeHandler->CheckFixedProperty(requestContext->GetPropertyName(propertyId), &property, requestContext))
            {
                Assert(value == nullptr || *value == property);
            }
        }
#endif

        CacheOperators::CachePropertyRead(instance, object, isRoot, propertyId, false, info, requestContext);
        return TRUE;
    }